

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

ssize_t __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write
          (xml_buffered_writer *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  
  uVar1 = this->bufsize;
  if (0x7fe < uVar1) {
    flush(this);
    uVar1 = 0;
  }
  this->buffer[uVar1] = (char_t)__fd;
  this->buffer[uVar1 + 1] = (char_t)__buf;
  this->bufsize = uVar1 + 2;
  return uVar1 + 2;
}

Assistant:

void write(char_t d0, char_t d1)
		{
			size_t offset = bufsize;
			if (offset > bufcapacity - 2) offset = flush();

			buffer[offset + 0] = d0;
			buffer[offset + 1] = d1;
			bufsize = offset + 2;
		}